

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_str.c
# Opt level: O2

StrHash hash_sparse_def(uint64_t seed,char *str,MSize len)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  
  uVar1 = (uint)seed ^ len;
  if (len < 4) {
    uVar2 = (uint)(byte)*str;
    uVar3 = (uint)(byte)str[len >> 1];
    uVar1 = (uVar1 ^ (byte)str[(ulong)len - 1] ^ uVar3) + uVar3 * -0x4000;
  }
  else {
    uVar2 = *(uint *)str;
    uVar3 = *(uint *)(str + ((ulong)(len >> 1) - 2));
    uVar1 = (uVar1 ^ *(uint *)(str + ((ulong)len - 4)) ^ uVar3) - (uVar3 << 0xe | uVar3 >> 0x12);
    uVar3 = uVar3 + *(int *)(str + ((ulong)(len >> 2) - 1));
  }
  uVar2 = (uVar2 ^ uVar1) - (uVar1 << 0xb | uVar1 >> 0x15);
  uVar2 = (uVar3 ^ uVar2) - (uVar2 * 0x2000000 | uVar2 >> 7);
  return (uVar1 ^ uVar2) - (uVar2 * 0x10000 | uVar2 >> 0x10);
}

Assistant:

static StrHash hash_sparse_def(uint64_t seed, const char *str, MSize len)
{
  /* Constants taken from lookup3 hash by Bob Jenkins. */
  StrHash a, b, h = len ^ (StrHash)seed;
  if (len >= 4) {  /* Caveat: unaligned access! */
    a = lj_getu32(str);
    h ^= lj_getu32(str+len-4);
    b = lj_getu32(str+(len>>1)-2);
    h ^= b; h -= lj_rol(b, 14);
    b += lj_getu32(str+(len>>2)-1);
  } else {
    a = *(const uint8_t *)str;
    h ^= *(const uint8_t *)(str+len-1);
    b = *(const uint8_t *)(str+(len>>1));
    h ^= b; h -= lj_rol(b, 14);
  }
  a ^= h; a -= lj_rol(h, 11);
  b ^= a; b -= lj_rol(a, 25);
  h ^= b; h -= lj_rol(b, 16);
  return h;
}